

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

QHostAddress __thiscall QNetmask::address(QNetmask *this,NetworkLayerProtocol protocol)

{
  byte bVar1;
  int in_EDX;
  quint32 ip4Addr;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Q_IPV6ADDR local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = *(byte *)CONCAT44(in_register_00000034,protocol);
  if ((bVar1 != 0xff) && (in_EDX != 2)) {
    ip4Addr = (quint32)bVar1;
    if (in_EDX == 0) {
      if (bVar1 != 0) {
        if (ip4Addr == 0x20) {
          ip4Addr = 0xffffffff;
        }
        else {
          ip4Addr = -1 << (-bVar1 & 0x1f);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QHostAddress::QHostAddress((QHostAddress *)this,ip4Addr);
        return (QExplicitlySharedDataPointer<QHostAddressPrivate>)
               (QExplicitlySharedDataPointer<QHostAddressPrivate>)this;
      }
      goto LAB_001abeb5;
    }
    if (in_EDX != -1) {
      local_28.c[0] = 0xff;
      local_28.c[1] = 0xff;
      local_28.c[2] = 0xff;
      local_28.c[3] = 0xff;
      local_28.c[4] = 0xff;
      local_28.c[5] = 0xff;
      local_28.c[6] = 0xff;
      local_28.c[7] = 0xff;
      local_28.c[8] = 0xff;
      local_28.c[9] = 0xff;
      local_28.c[10] = 0xff;
      local_28.c[0xb] = 0xff;
      local_28.c[0xc] = 0xff;
      local_28.c[0xd] = 0xff;
      local_28.c[0xe] = 0xff;
      local_28.c[0xf] = 0xff;
      clearBits(local_28.c,ip4Addr,in_EDX);
      QHostAddress::QHostAddress((QHostAddress *)this,&local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return (QExplicitlySharedDataPointer<QHostAddressPrivate>)
               (QExplicitlySharedDataPointer<QHostAddressPrivate>)this;
      }
      goto LAB_001abeb5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QHostAddress::QHostAddress((QHostAddress *)this);
    return (QExplicitlySharedDataPointer<QHostAddressPrivate>)
           (QExplicitlySharedDataPointer<QHostAddressPrivate>)this;
  }
LAB_001abeb5:
  __stack_chk_fail();
}

Assistant:

QHostAddress QNetmask::address(QHostAddress::NetworkLayerProtocol protocol) const
{
    if (length == 255 || protocol == QHostAddress::AnyIPProtocol ||
            protocol == QHostAddress::UnknownNetworkLayerProtocol) {
        return QHostAddress();
    } else if (protocol == QHostAddress::IPv4Protocol) {
        quint32 a;
        if (length == 0)
            a = 0;
        else if (length == 32)
            a = quint32(0xffffffff);
        else
            a = quint32(0xffffffff) >> (32 - length) << (32 - length);
        return QHostAddress(a);
    } else {
        Q_IPV6ADDR a6;
        memset(a6.c, 0xFF, sizeof(a6));
        clearBits(a6.c, length, 128);
        return QHostAddress(a6);
    }
}